

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Line_SetBlocking(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  FLineIdIterator itr;
  FLineIdIterator local_28;
  
  if (arg0 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | -(arg1 & 1U) & *(uint *)((long)LS_Line_SetBlocking::flagtrans + lVar2);
      uVar3 = uVar3 | -(arg2 & 1U) & *(uint *)((long)LS_Line_SetBlocking::flagtrans + lVar2);
      arg1 = arg1 >> 1;
      arg2 = arg2 >> 1;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x2c);
    local_28.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
    local_28.searchtag = arg0;
    uVar1 = FLineIdIterator::Next(&local_28);
    if (-1 < (int)uVar1) {
      do {
        lines[uVar1].flags = lines[uVar1].flags & ~uVar3 | uVar4;
        uVar1 = FLineIdIterator::Next(&local_28);
      } while (-1 < (int)uVar1);
    }
    return 1;
  }
  return 0;
}

Assistant:

FUNC(LS_Line_SetBlocking)
// Line_SetBlocking (id, setflags, clearflags)
{
	static const int flagtrans[] =
	{
		ML_BLOCKING,
		ML_BLOCKMONSTERS,
		ML_BLOCK_PLAYERS,
		ML_BLOCK_FLOATERS,
		ML_BLOCKPROJECTILE,
		ML_BLOCKEVERYTHING,
		ML_RAILING,
		ML_BLOCKUSE,
		ML_BLOCKSIGHT,
		ML_BLOCKHITSCAN,
		ML_SOUNDBLOCK,
		-1
	};

	if (arg0 == 0) return false;

	int setflags = 0;
	int clearflags = 0;

	for(int i = 0; flagtrans[i] != -1; i++, arg1 >>= 1, arg2 >>= 1)
	{
		if (arg1 & 1) setflags |= flagtrans[i];
		if (arg2 & 1) clearflags |= flagtrans[i];
	}

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		lines[line].flags = (lines[line].flags & ~clearflags) | setflags;
	}
	return true;
}